

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Http.cpp
# Opt level: O0

void __thiscall hwnet::http::HttpRequest::WriteHeader(HttpRequest *this,function<void_()> *writeOk)

{
  bool bVar1;
  element_type *this_00;
  element_type *callback;
  element_type *peVar2;
  function<void_()> local_98;
  function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&)> local_78;
  undefined1 local_58 [32];
  undefined1 local_38 [8];
  string header;
  function<void_()> *writeOk_local;
  HttpRequest *this_local;
  
  header.field_2._8_8_ = writeOk;
  std::__cxx11::string::string((string *)local_38);
  this_00 = std::
            __shared_ptr_access<hwnet::http::HttpPacket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<hwnet::http::HttpPacket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->packet);
  HttpPacket::MakeHeader(this_00,1,(string *)local_38);
  bVar1 = std::function::operator_cast_to_bool((function *)header.field_2._8_8_);
  if (bVar1) {
    peVar2 = std::
             __shared_ptr_access<hwnet::http::HttpSession,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<hwnet::http::HttpSession,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->session);
    callback = std::__shared_ptr_access<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&peVar2->s);
    std::function<void_()>::function(&local_98,(function<void_()> *)header.field_2._8_8_);
    std::function<void(std::shared_ptr<hwnet::TCPSocket>const&)>::
    function<hwnet::http::HttpRequest::WriteHeader(std::function<void()>const&)::__0,void>
              ((function<void(std::shared_ptr<hwnet::TCPSocket>const&)> *)&local_78,
               (anon_class_32_1_e2e618fb *)&local_98);
    TCPSocket::SetFlushCallback((TCPSocket *)local_58,(FlushCallback *)callback);
    std::shared_ptr<hwnet::TCPSocket>::~shared_ptr((shared_ptr<hwnet::TCPSocket> *)local_58);
    std::function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&)>::~function(&local_78);
    WriteHeader(std::function<void()>const&)::$_0::~__0((__0 *)&local_98);
  }
  peVar2 = std::
           __shared_ptr_access<hwnet::http::HttpSession,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<hwnet::http::HttpSession,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->session);
  HttpSession::Send(peVar2,(string *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void HttpRequest::WriteHeader(const std::function<void ()> &writeOk) {
	std::string header;
	this->packet->MakeHeader(HttpPacket::request,header);
	if(writeOk){
		this->session->s->SetFlushCallback([writeOk](const TCPSocket::Ptr &_){
			(void)_;	
			writeOk();
		});
	}
	this->session->Send(header);
}